

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c++
# Opt level: O0

void kj::_::throwDoubleAdd(void)

{
  char (*in_RCX) [70];
  String local_1b0;
  Exception local_198;
  
  Debug::makeDescription<char_const(&)[70]>
            (&local_1b0,
             (Debug *)"\"tried to add element to kj::List but the element is already in a list\"",
             "tried to add element to kj::List but the element is already in a list",in_RCX);
  Exception::Exception
            (&local_198,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list.c++"
             ,0x1e,&local_1b0);
  throwFatalException(&local_198,0);
}

Assistant:

void throwDoubleAdd() {
  kj::throwFatalException(KJ_EXCEPTION(FAILED,
      "tried to add element to kj::List but the element is already in a list"));
}